

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vampire.cpp
# Opt level: O2

void outputUnitToLaTeX(LaTeX *latex,ofstream *latexOut,Unit *u,uint index)

{
  ostream *poVar1;
  uint uVar2;
  _Alloc_hider _Var3;
  string stringform;
  string local_40;
  
  Shell::LaTeX::toString_abi_cxx11_(&local_40,latex,u);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)latexOut);
  std::operator<<(poVar1," & ");
  uVar2 = 0;
  for (_Var3._M_p = local_40._M_dataplus._M_p; *_Var3._M_p != '\0'; _Var3._M_p = _Var3._M_p + 1) {
    std::operator<<((ostream *)latexOut,*_Var3._M_p);
    uVar2 = uVar2 + 1;
    if ((0x50 < uVar2) && (*_Var3._M_p == ' ')) {
      uVar2 = 0;
      std::operator<<((ostream *)latexOut,"\\\\ \n & ~~~~~");
    }
  }
  poVar1 = std::operator<<((ostream *)latexOut,"\\\\");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void outputUnitToLaTeX(LaTeX& latex, ofstream& latexOut, Unit* u,unsigned index)
{
    std::string stringform = latex.toString(u);
    latexOut << index++ << " & ";
    unsigned count = 0;
    for(const char* p = stringform.c_str();*p;p++){
      latexOut << *p;
      count++;
      if(count>80 && *p==' '){
        latexOut << "\\\\ \n & ~~~~~";
        count=0;
      }
    }
    latexOut << "\\\\" << endl;
}